

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

void __thiscall Wasm::WasmBytecodeGenerator::PrintTypeStack(WasmBytecodeGenerator *this)

{
  WasmBytecodeGenerator *this_local;
  
  WriteTypeStack<Wasm::WasmBytecodeGenerator::PrintTypeStack()const::__0>(this);
  return;
}

Assistant:

void WasmBytecodeGenerator::PrintTypeStack() const
{
    WriteTypeStack([](const char16* msg) { Output::Print(msg); });
}